

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O3

void __thiscall MIDIplay::updateArpeggio(MIDIplay *this,double param_1)

{
  ushort uVar1;
  OPL3 *pOVar2;
  pointer pAVar3;
  long lVar4;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar5;
  notes_iterator i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((this->m_setup).enableAutoArpeggio == false) {
    if (this->m_arpeggioCounter != 0) {
      this->m_arpeggioCounter = 0;
    }
  }
  else {
    pOVar2 = (this->m_synth).m_p;
    this->m_arpeggioCounter = this->m_arpeggioCounter + 1;
    if (pOVar2->m_numChannels != 0) {
      uVar8 = 0;
      do {
        pAVar3 = (this->m_chipChannels).
                 super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = pAVar3[uVar8].users.size_;
        while (1 < uVar6) {
          uVar7 = (ulong)(uVar6 == 2) | 2;
          if (3 < uVar6) {
            uVar7 = 1;
          }
          uVar6 = (this->m_arpeggioCounter / uVar7) % uVar6;
          ppVar5 = pAVar3[uVar8].users.first_;
          if (uVar6 != 0) {
            uVar7 = 0;
            do {
              uVar7 = uVar7 + 1;
              ppVar5 = (ppVar5->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next;
            } while (uVar7 < uVar6);
          }
          if ((ppVar5->value).sustained != 0) break;
          lVar4 = (ppVar5->value).kon_time_until_neglible_us;
          uVar1 = (ppVar5->value).loc.MidCh;
          i = MIDIchannel::ensure_find_activenote
                        ((MIDIchannel *)
                         (((this->m_midiChannels).
                           super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                           ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch +
                         (ulong)((uint)uVar1 * 0x140) + -0x28),(uint)(ppVar5->value).loc.note);
          if (0 < lVar4) {
            noteUpdate(this,(ulong)uVar1,i,0xe,(int32_t)uVar8);
            break;
          }
          noteUpdate(this,(ulong)uVar1,i,0x20,(int32_t)uVar8);
          pAVar3 = (this->m_chipChannels).
                   super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar6 = pAVar3[uVar8].users.size_;
        }
        uVar8 = uVar8 + 1;
      } while ((-1 < (int)uVar8) && (uVar8 < pOVar2->m_numChannels));
    }
  }
  return;
}

Assistant:

void MIDIplay::updateArpeggio(double) // amount = amount of time passed
{
    // If there is an adlib channel that has multiple notes
    // simulated on the same channel, arpeggio them.

    Synth &synth = *m_synth;

    if(!m_setup.enableAutoArpeggio) // Arpeggio was disabled
    {
        if(m_arpeggioCounter != 0)
            m_arpeggioCounter = 0;
        return;
    }

#if 0
    const unsigned desired_arpeggio_rate = 40; // Hz (upper limit)
#   if 1
    static unsigned cache = 0;
    amount = amount; // Ignore amount. Assume we get a constant rate.
    cache += MaxSamplesAtTime * desired_arpeggio_rate;

    if(cache < PCM_RATE) return;

    cache %= PCM_RATE;
#   else
    static double arpeggio_cache = 0;
    arpeggio_cache += amount * desired_arpeggio_rate;

    if(arpeggio_cache < 1.0) return;

    arpeggio_cache = 0.0;
#   endif
#endif

    ++m_arpeggioCounter;

    for(uint32_t c = 0; c < synth.m_numChannels; ++c)
    {
retry_arpeggio:
        if(c > uint32_t(std::numeric_limits<int32_t>::max()))
            break;

        size_t n_users = m_chipChannels[c].users.size();

        if(n_users > 1)
        {
            AdlChannel::users_iterator i = m_chipChannels[c].users.begin();
            size_t rate_reduction = 3;

            if(n_users >= 3)
                rate_reduction = 2;

            if(n_users >= 4)
                rate_reduction = 1;

            for(size_t count = (m_arpeggioCounter / rate_reduction) % n_users,
                n = 0; n < count; ++n)
                ++i;

            AdlChannel::LocationData &d = i->value;
            if(d.sustained == AdlChannel::LocationData::Sustain_None)
            {
                if(d.kon_time_until_neglible_us <= 0)
                {
                    noteUpdate(
                        d.loc.MidCh,
                        m_midiChannels[ d.loc.MidCh ].ensure_find_activenote(d.loc.note),
                        Upd_Off,
                        static_cast<int32_t>(c));
                    goto retry_arpeggio;
                }

                noteUpdate(
                    d.loc.MidCh,
                    m_midiChannels[ d.loc.MidCh ].ensure_find_activenote(d.loc.note),
                    Upd_Pitch | Upd_Volume | Upd_Pan,
                    static_cast<int32_t>(c));
            }
        }
    }
}